

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O2

int * pstore::sparse_array<int,unsigned_int>::
      index_impl<pstore::sparse_array<int,unsigned_int>&,int>
                (sparse_array<int,_unsigned_int> *sa,size_type pos)

{
  int line;
  char *str;
  
  if (pos < 0x20) {
    if ((sa->bitmap_ >> ((uint)pos & 0x1f) & 1) != 0) {
      return sa->elements_ + (uint)POPCOUNT(sa->bitmap_ & (1 << ((byte)pos & 0x1f)) - 1U);
    }
    line = 0x26a;
    str = "(sa.bitmap_ & mask) != 0U";
  }
  else {
    line = 0x268;
    str = "pos < max_size ()";
  }
  assert_failed(str,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/sparse_array.hpp"
                ,line);
}

Assistant:

ResultType & sparse_array<ValueType, BitmapType>::index_impl (SparseArray && sa,
                                                                  size_type pos) noexcept {
        PSTORE_ASSERT (pos < max_size ());
        auto mask = BitmapType{1U} << pos;
        PSTORE_ASSERT ((sa.bitmap_ & mask) != 0U);
        mask--;
        return sa.elements_[bit_count::pop_count (static_cast<BitmapType> (sa.bitmap_ & mask))];
    }